

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

_Bool monster_can_hear(monster_conflict *mon)

{
  monster_conflict *pmVar1;
  uint16_t **local_28;
  heatmap noise_map;
  wchar_t hearing;
  monster_conflict *mon_local;
  
  noise_map.grids._4_4_ = mon->race->hearing;
  memset(&local_28,0,8);
  if ((mon->target).midx == L'\xffffffff') {
    local_28 = (cave->noise).grids;
    noise_map.grids._4_4_ = noise_map.grids._4_4_ - (player->state).skills[5] / 3;
  }
  else {
    if ((mon->target).midx < L'\x01') {
      return false;
    }
    pmVar1 = cave_monster(cave,(mon->target).midx);
    local_28 = (pmVar1->noise).grids;
  }
  if (local_28[(mon->grid).y][(mon->grid).x] == 0) {
    mon_local._7_1_ = false;
  }
  else {
    mon_local._7_1_ = (int)(uint)local_28[(mon->grid).y][(mon->grid).x] < noise_map.grids._4_4_;
  }
  return mon_local._7_1_;
}

Assistant:

static bool monster_can_hear(struct monster *mon)
{
	int hearing = mon->race->hearing;
	struct heatmap noise_map = { 0 };

	/* Set target info */
	if (mon->target.midx == -1) {
		noise_map = cave->noise;
		hearing -= player->state.skills[SKILL_STEALTH] / 3;
	} else if (mon->target.midx > 0) {
		noise_map = cave_monster(cave, mon->target.midx)->noise;
	} else {
		return false;
	}

	/* Try and hear */
	if (noise_map.grids[mon->grid.y][mon->grid.x] == 0) {
		return false;
	}
	return hearing > noise_map.grids[mon->grid.y][mon->grid.x];
}